

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t do_mvcl(CPUS390XState_conflict *env,uint64_t *dest,uint64_t *destlen,uint64_t *src,
                uint64_t *srclen,uint16_t pad,int wordsize,uintptr_t ra)

{
  int mmu_idx_00;
  uint64_t uVar1;
  uint32_t local_164;
  int local_160;
  int local_158;
  ulong local_150;
  int local_148;
  S390Access local_140;
  S390Access local_118;
  S390Access local_f0;
  S390Access local_c8;
  uint32_t local_a0;
  int local_9c;
  int cc;
  int i;
  S390Access desta;
  S390Access srca;
  int len;
  int mmu_idx;
  uint16_t pad_local;
  uint64_t *srclen_local;
  uint64_t *src_local;
  uint64_t *destlen_local;
  uint64_t *dest_local;
  CPUS390XState_conflict *env_local;
  
  mmu_idx_00 = cpu_mmu_index(env,false);
  if (*destlen < -(*dest | 0xfffffffffffff000)) {
    local_148 = (int)*destlen;
  }
  else {
    local_148 = -((uint)*dest | 0xfffff000);
  }
  if (*destlen == *srclen) {
    local_a0 = 0;
  }
  else if (*destlen < *srclen) {
    local_a0 = 1;
  }
  else {
    local_a0 = 2;
  }
  if (*destlen == 0) {
    env_local._4_4_ = local_a0;
  }
  else {
    if (*srclen == 0) {
      if (wordsize == 1) {
        *destlen = *destlen - (long)local_148;
        access_prepare(&local_118,env,*dest,local_148,MMU_DATA_STORE,mmu_idx_00,ra);
        memcpy(&cc,&local_118,0x28);
        access_memset(env,(S390Access *)&cc,(uint8_t)pad,ra);
        uVar1 = wrap_address(env,*dest + (long)local_148);
        *dest = uVar1;
      }
      else {
        access_prepare(&local_140,env,*dest,local_148,MMU_DATA_STORE,mmu_idx_00,ra);
        memcpy(&cc,&local_140,0x28);
        for (local_9c = 0; local_9c < local_148; local_9c = local_9c + 1) {
          if ((*destlen & 1) == 0) {
            access_set_byte(env,(S390Access *)&cc,local_9c,(uint8_t)(pad >> 8),ra);
          }
          else {
            access_set_byte(env,(S390Access *)&cc,local_9c,(uint8_t)pad,ra);
          }
          *destlen = *destlen - 1;
        }
        uVar1 = wrap_address(env,*dest + (long)local_148);
        *dest = uVar1;
      }
    }
    else {
      if (*srclen < -(*src | 0xfffffffffffff000)) {
        local_150 = *srclen;
      }
      else {
        local_150 = -(*src | 0xfffffffffffff000);
      }
      if (local_150 < (ulong)(long)local_148) {
        if (*srclen < -(*src | 0xfffffffffffff000)) {
          local_158 = (int)*srclen;
        }
        else {
          local_158 = -((uint)*src | 0xfffff000);
        }
        local_160 = local_158;
      }
      else {
        local_160 = local_148;
      }
      *destlen = *destlen - (long)local_160;
      *srclen = *srclen - (long)local_160;
      access_prepare(&local_c8,env,*src,local_160,MMU_DATA_LOAD,mmu_idx_00,ra);
      memcpy(&desta.size1,&local_c8,0x28);
      access_prepare(&local_f0,env,*dest,local_160,MMU_DATA_STORE,mmu_idx_00,ra);
      memcpy(&cc,&local_f0,0x28);
      access_memmove(env,(S390Access *)&cc,(S390Access *)&desta.size1,ra);
      uVar1 = wrap_address(env,*src + (long)local_160);
      *src = uVar1;
      uVar1 = wrap_address(env,*dest + (long)local_160);
      *dest = uVar1;
    }
    if (*destlen == 0) {
      local_164 = local_a0;
    }
    else {
      local_164 = 3;
    }
    env_local._4_4_ = local_164;
  }
  return env_local._4_4_;
}

Assistant:

static inline uint32_t do_mvcl(CPUS390XState *env,
                               uint64_t *dest, uint64_t *destlen,
                               uint64_t *src, uint64_t *srclen,
                               uint16_t pad, int wordsize, uintptr_t ra)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    int len = MIN(*destlen, -(*dest | TARGET_PAGE_MASK));
    S390Access srca, desta;
    int i, cc;

    if (*destlen == *srclen) {
        cc = 0;
    } else if (*destlen < *srclen) {
        cc = 1;
    } else {
        cc = 2;
    }

    if (!*destlen) {
        return cc;
    }

    /*
     * Only perform one type of type of operation (move/pad) at a time.
     * Stay within single pages.
     */
    if (*srclen) {
        /* Copy the src array */
        len = MIN(MIN(*srclen, -(*src | TARGET_PAGE_MASK)), len);
        *destlen -= len;
        *srclen -= len;
        srca = access_prepare(env, *src, len, MMU_DATA_LOAD, mmu_idx, ra);
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);
        access_memmove(env, &desta, &srca, ra);
        *src = wrap_address(env, *src + len);
        *dest = wrap_address(env, *dest + len);
    } else if (wordsize == 1) {
        /* Pad the remaining area */
        *destlen -= len;
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);
        access_memset(env, &desta, pad, ra);
        *dest = wrap_address(env, *dest + len);
    } else {
        desta = access_prepare(env, *dest, len, MMU_DATA_STORE, mmu_idx, ra);

        /* The remaining length selects the padding byte. */
        for (i = 0; i < len; (*destlen)--, i++) {
            if (*destlen & 1) {
                access_set_byte(env, &desta, i, pad, ra);
            } else {
                access_set_byte(env, &desta, i, pad >> 8, ra);
            }
        }
        *dest = wrap_address(env, *dest + len);
    }

    return *destlen ? 3 : cc;
}